

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_alias.cpp
# Opt level: O2

void __thiscall duckdb::BindingAlias::BindingAlias(BindingAlias *this,StandardEntry *entry)

{
  int iVar1;
  undefined4 extraout_var;
  string *psVar2;
  
  iVar1 = (*(entry->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0xc])(entry);
  psVar2 = Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar1));
  ::std::__cxx11::string::string((string *)this,(string *)psVar2);
  ::std::__cxx11::string::string
            ((string *)&this->schema,
             (string *)&(entry->schema->super_InCatalogEntry).super_CatalogEntry.name);
  ::std::__cxx11::string::string
            ((string *)&this->alias,(string *)&(entry->super_InCatalogEntry).super_CatalogEntry.name
            );
  return;
}

Assistant:

BindingAlias::BindingAlias(const StandardEntry &entry)
    : catalog(entry.ParentCatalog().GetName()), schema(entry.schema.name), alias(entry.name) {
}